

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe_test.c
# Opt level: O2

void notify(nng_pipe p,nng_pipe_ev act,void *arg)

{
  nng_socket s;
  int iVar1;
  int iVar2;
  nng_listener l;
  nng_dialer d;
  
  nng_mtx_lock(*(nng_mtx **)((long)arg + 0x28));
  s = nng_pipe_socket(p);
  iVar1 = nng_socket_id(s);
  iVar2 = nng_socket_id((nng_socket)*arg);
  if (iVar1 == iVar2) {
    l = nng_pipe_listener(p);
    iVar1 = nng_listener_id(l);
    iVar2 = nng_listener_id((nng_listener)*(uint32_t *)((long)arg + 8));
    if (iVar1 == iVar2) {
      d = nng_pipe_dialer(p);
      iVar1 = nng_dialer_id(d);
      iVar2 = nng_dialer_id((nng_dialer)*(uint32_t *)((long)arg + 4));
      if (iVar1 == iVar2) {
        if (*(int *)((long)arg + 0x10) < *(int *)((long)arg + 0x14)) {
          *(int *)((long)arg + 0x1c) = *(int *)((long)arg + 0x1c) + 1;
        }
        if (act == NNG_PIPE_EV_REM_POST) {
          *(int *)((long)arg + 0x18) = *(int *)((long)arg + 0x18) + 1;
        }
        else if (act == NNG_PIPE_EV_ADD_POST) {
          *(int *)((long)arg + 0x14) = *(int *)((long)arg + 0x14) + 1;
        }
        else {
          if (act != NNG_PIPE_EV_ADD_PRE) goto LAB_0010b459;
          *(int *)((long)arg + 0x10) = *(int *)((long)arg + 0x10) + 1;
        }
        *(uint32_t *)((long)arg + 0xc) = p.id;
        goto LAB_0010b45c;
      }
    }
  }
LAB_0010b459:
  *(int *)((long)arg + 0x1c) = *(int *)((long)arg + 0x1c) + 1;
LAB_0010b45c:
  nng_cv_wake(*(nng_cv **)((long)arg + 0x30));
  nng_mtx_unlock(*(nng_mtx **)((long)arg + 0x28));
  return;
}

Assistant:

void
notify(nng_pipe p, nng_pipe_ev act, void *arg)
{
	struct testcase *t = arg;

	nng_mtx_lock(t->lk);
	if ((nng_socket_id(nng_pipe_socket(p)) != nng_socket_id(t->s)) ||
	    (nng_listener_id(nng_pipe_listener(p)) != nng_listener_id(t->l)) ||
	    (nng_dialer_id(nng_pipe_dialer(p)) != nng_dialer_id(t->d))) {
		t->err++;
		nng_cv_wake(t->cv);
		nng_mtx_unlock(t->lk);
		return;
	}
	if (t->add_post > t->add_pre) {
		t->err++;
	}
	switch (act) {
	case NNG_PIPE_EV_ADD_PRE:
		t->add_pre++;
		break;
	case NNG_PIPE_EV_ADD_POST:
		t->add_post++;
		break;
	case NNG_PIPE_EV_REM_POST:
		t->rem++;
		break;
	default:
		t->err++;
		nng_cv_wake(t->cv);
		nng_mtx_unlock(t->lk);
		return;
	}
	t->p = p;
	nng_cv_wake(t->cv);
	nng_mtx_unlock(t->lk);
}